

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O2

bool __thiscall ParseNodeBlock::HasBlockScopedContent(ParseNodeBlock *this)

{
  OpCode OVar1;
  ParseNode *this_00;
  code *pcVar2;
  bool bVar3;
  ParseNodeCatch *pPVar4;
  ParseNodeBlock *pPVar5;
  undefined4 *puVar6;
  ParseNodePtr *ppPVar7;
  
  if ((this->pnodeLexVars != (ParseNodePtr)0x0) || ((~this->field_0x5c & 3) == 0)) {
    return true;
  }
  do {
    ppPVar7 = &this->pnodeScopes;
    while( true ) {
      while( true ) {
        this_00 = *ppPVar7;
        bVar3 = this_00 != (ParseNode *)0x0;
        if (this_00 == (ParseNode *)0x0) {
          return bVar3;
        }
        OVar1 = this_00->nop;
        if (OVar1 != knopBlock) break;
        pPVar5 = ParseNode::AsParseNodeBlock(this_00);
        ppPVar7 = &pPVar5->pnodeNext;
      }
      if (OVar1 == knopWith) break;
      if (OVar1 != knopCatch) {
        if (OVar1 == knopFncDecl) {
          return bVar3;
        }
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                           ,0x3145,"((0))","UNREACHED");
        if (bVar3) {
          *puVar6 = 0;
          return true;
        }
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      pPVar4 = ParseNode::AsParseNodeCatch(this_00);
      ppPVar7 = &pPVar4->pnodeNext;
    }
    this = (ParseNodeBlock *)ParseNode::AsParseNodeWith(this_00);
  } while( true );
}

Assistant:

bool ParseNodeBlock::HasBlockScopedContent() const
{
    // A block has its own content if a let, const, or function is declared there.

    if (this->pnodeLexVars != nullptr || this->blockType == Parameter)
    {
        return true;
    }

    // The enclosing scopes can contain functions and other things, so walk the list
    // looking specifically for functions.

    for (ParseNodePtr pnode = this->pnodeScopes; pnode;)
    {
        switch (pnode->nop) {

        case knopFncDecl:
            return true;

        case knopBlock:
            pnode = pnode->AsParseNodeBlock()->pnodeNext;
            break;

        case knopCatch:
            pnode = pnode->AsParseNodeCatch()->pnodeNext;
            break;

        case knopWith:
            pnode = pnode->AsParseNodeWith()->pnodeNext;
            break;

        default:
            Assert(UNREACHED);
            return true;
        }
    }

    return false;
}